

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenTry(BinaryenModuleRef module,char *name,BinaryenExpressionRef body,char **catchTags,
           BinaryenIndex numCatchTags,BinaryenExpressionRef *catchBodies,
           BinaryenIndex numCatchBodies,char *delegateTarget)

{
  ArenaVector<wasm::Name> *this;
  BinaryenExpressionRef *ppEVar1;
  Try *this_00;
  ulong uVar2;
  ExpressionList *this_01;
  Name local_60;
  string_view local_50;
  BinaryenExpressionRef *local_40;
  Try *local_38;
  
  local_40 = catchBodies;
  local_38 = MixedArena::alloc<wasm::Try>(&module->allocator);
  if (name != (char *)0x0) {
    wasm::Name::Name(&local_60,name);
    (local_38->name).super_IString.str._M_len = local_60.super_IString.str._M_len;
    (local_38->name).super_IString.str._M_str = local_60.super_IString.str._M_str;
  }
  local_38->body = body;
  this = &local_38->catchTags;
  for (uVar2 = 0; ppEVar1 = local_40, numCatchTags != uVar2; uVar2 = uVar2 + 1) {
    wasm::Name::Name((Name *)&local_50,catchTags[uVar2]);
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::push_back
              (&this->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,(Name)local_50);
  }
  this_01 = &local_38->catchBodies;
  for (uVar2 = 0; this_00 = local_38, numCatchBodies != uVar2; uVar2 = uVar2 + 1) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_01->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               ppEVar1[uVar2]);
  }
  if (delegateTarget != (char *)0x0) {
    wasm::Name::Name(&local_60,delegateTarget);
    (this_00->delegateTarget).super_IString.str._M_len = local_60.super_IString.str._M_len;
    (this_00->delegateTarget).super_IString.str._M_str = local_60.super_IString.str._M_str;
  }
  wasm::Try::finalize(this_00);
  return (BinaryenExpressionRef)this_00;
}

Assistant:

BinaryenExpressionRef BinaryenTry(BinaryenModuleRef module,
                                  const char* name,
                                  BinaryenExpressionRef body,
                                  const char** catchTags,
                                  BinaryenIndex numCatchTags,
                                  BinaryenExpressionRef* catchBodies,
                                  BinaryenIndex numCatchBodies,
                                  const char* delegateTarget) {
  auto* ret = ((Module*)module)->allocator.alloc<Try>();
  if (name) {
    ret->name = name;
  }
  ret->body = (Expression*)body;
  for (BinaryenIndex i = 0; i < numCatchTags; i++) {
    ret->catchTags.push_back(catchTags[i]);
  }
  for (BinaryenIndex i = 0; i < numCatchBodies; i++) {
    ret->catchBodies.push_back((Expression*)catchBodies[i]);
  }
  if (delegateTarget) {
    ret->delegateTarget = delegateTarget;
  }
  ret->finalize();
  return static_cast<Expression*>(ret);
}